

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int * mbedtls_cipher_list(void)

{
  long lVar1;
  
  if (supported_init == '\0') {
    for (lVar1 = 0; (&mbedtls_cipher_definitions[0].type)[lVar1] != MBEDTLS_CIPHER_NONE;
        lVar1 = lVar1 + 4) {
      *(mbedtls_cipher_type_t *)((long)mbedtls_cipher_supported + lVar1) =
           (&mbedtls_cipher_definitions[0].type)[lVar1];
    }
    *(undefined4 *)((long)mbedtls_cipher_supported + lVar1) = 0;
    supported_init = '\x01';
  }
  return mbedtls_cipher_supported;
}

Assistant:

const int *mbedtls_cipher_list(void)
{
    const mbedtls_cipher_definition_t *def;
    int *type;

    if (!supported_init) {
        def = mbedtls_cipher_definitions;
        type = mbedtls_cipher_supported;

        while (def->type != 0) {
            *type++ = (*def++).type;
        }

        *type = 0;

        supported_init = 1;
    }

    return mbedtls_cipher_supported;
}